

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>::iterator,_bool>
* __thiscall
phmap::container_internal::
raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
::try_emplace_impl<unsigned_long_const&>
          (pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
          *this,unsigned_long *k)

{
  size_t i;
  pair<unsigned_long,_bool> pVar1;
  iterator local_58;
  tuple<> local_41;
  tuple<const_unsigned_long_&> local_40;
  size_t local_38;
  undefined1 local_30;
  size_t local_28;
  pair<unsigned_long,_bool> res;
  unsigned_long *k_local;
  raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
  *this_local;
  
  res._8_8_ = k;
  pVar1 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find_or_prepare_insert<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)this,k);
  i = pVar1.first;
  local_30 = pVar1.second;
  local_38 = i;
  local_28 = i;
  res.first._0_1_ = local_30;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::forward_as_tuple<unsigned_long_const&>((unsigned_long *)&local_40);
    std::forward_as_tuple<>();
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
              ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                *)this,i,(piecewise_construct_t *)&std::piecewise_construct,&local_40,&local_41);
  }
  local_58 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
             ::iterator_at((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                            *)this,local_28);
  std::
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>::iterator,_bool>
  ::
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>::iterator,_bool_&,_true>
            (__return_storage_ptr__,&local_58,(bool *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args) {
        auto res = this->find_or_prepare_insert(k);
        if (res.second)
            this->emplace_at(res.first, std::piecewise_construct,
                             std::forward_as_tuple(std::forward<K>(k)),
                             std::forward_as_tuple(std::forward<Args>(args)...));
        return {this->iterator_at(res.first), res.second};
    }